

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

int ma_wcscpy_s(wchar_t *dst,size_t dstCap,wchar_t *src)

{
  int iVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  
  if (dst == (wchar_t *)0x0) {
    iVar1 = 0x16;
  }
  else {
    if (dstCap != 0) {
      if (src == (wchar_t *)0x0) {
        iVar1 = 0x16;
      }
      else {
        iVar1 = 0x22;
        pwVar3 = dst;
        for (sVar2 = 0; dstCap != sVar2; sVar2 = sVar2 + 1) {
          if (src[sVar2] == L'\0') {
            iVar1 = 0;
            dst = pwVar3;
            break;
          }
          *pwVar3 = src[sVar2];
          pwVar3 = pwVar3 + 1;
        }
      }
      *dst = L'\0';
      return iVar1;
    }
    iVar1 = 0x22;
  }
  return iVar1;
}

Assistant:

MA_API MA_NO_INLINE int ma_wcscpy_s(wchar_t* dst, size_t dstCap, const wchar_t* src)
{
    size_t i;

    if (dst == 0) {
        return 22;
    }
    if (dstCap == 0) {
        return 34;
    }
    if (src == 0) {
        dst[0] = '\0';
        return 22;
    }

    for (i = 0; i < dstCap && src[i] != '\0'; ++i) {
        dst[i] = src[i];
    }

    if (i < dstCap) {
        dst[i] = '\0';
        return 0;
    }

    dst[0] = '\0';
    return 34;
}